

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O3

void cert_expr_builder_add(CertExprBuilder *eb,char *wildcard)

{
  size_t sVar1;
  _Bool _Var2;
  Token TVar3;
  size_t sVar4;
  char **ppcVar5;
  char *pcVar6;
  ptrlen input;
  ptrlen pl;
  char *err;
  ptrlen toktext;
  char *local_40;
  ptrlen local_38;
  ptrlen local_28;
  
  sVar4 = strlen(wildcard);
  local_28.ptr = wildcard;
  local_28.len = sVar4;
  TVar3 = lex(&local_28,&local_38,&local_40);
  if (TVar3 != TOK_ERROR) {
    if (((TVar3 == TOK_ATOM) && ((char *)local_38.ptr == wildcard)) && (local_38.len == sVar4)) {
      input.len = sVar4;
      input.ptr = local_38.ptr;
      _Var2 = ptrlen_contains(input,":/");
      if (!_Var2) {
        ppcVar5 = (char **)safegrowarray(eb->wcs,&eb->wcsize,8,eb->nwcs,1,false);
        eb->wcs = ppcVar5;
        pl.len = sVar4;
        pl.ptr = wildcard;
        pcVar6 = mkstr(pl);
        sVar1 = eb->nwcs;
        eb->nwcs = sVar1 + 1;
        eb->wcs[sVar1] = pcVar6;
      }
    }
    return;
  }
  safefree(local_40);
  return;
}

Assistant:

void cert_expr_builder_add(CertExprBuilder *eb, const char *wildcard)
{
    /* Check this wildcard is lexically valid as an atom */
    ptrlen orig = ptrlen_from_asciz(wildcard), pl = orig;
    ptrlen toktext;
    char *err;
    Token tok = lex(&pl, &toktext, &err);
    if (!(tok == TOK_ATOM &&
          toktext.ptr == orig.ptr &&
          toktext.len == orig.len &&
          atom_is_hostname_wc(toktext))) {
        if (tok == TOK_ERROR)
            sfree(err);
        return;
    }

    sgrowarray(eb->wcs, eb->wcsize, eb->nwcs);
    eb->wcs[eb->nwcs++] = mkstr(orig);
}